

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventAgentTest.cpp
# Opt level: O0

void runSyncRetTests(void)

{
  undefined1 local_22c [4];
  bool local_228;
  int8_t local_227;
  int16_t local_226;
  int32_t local_224;
  bool p9;
  int8_t p8;
  int16_t p7;
  int32_t p6;
  int64_t p5;
  undefined1 uStack_20e;
  uint8_t p4;
  CopyCounterGuy ccg1;
  uint16_t p3;
  uint64_t uStack_208;
  uint32_t p2;
  uint64_t p1;
  CopyCounterGuy local_1ec;
  undefined1 local_1e8 [4];
  CopyCounterGuy returnCCG;
  TestClass app;
  
  TestClass::TestClass((TestClass *)local_1e8);
  TestClass::CopyCounterGuy::CopyCounterGuy(&local_1ec);
  uStack_208 = 0x400;
  ccg1.mCount = 0x200;
  _uStack_20e = 0x100;
  TestClass::CopyCounterGuy::CopyCounterGuy((CopyCounterGuy *)((long)&p5 + 4));
  p5._3_1_ = 0x10;
  _p9 = 0xfffffffffffffc00;
  local_224 = -0x200;
  local_226 = -0x100;
  local_227 = -0x10;
  local_228 = true;
  TestClass::SyncRetFunc0((TestClass *)local_1e8);
  TestClass::SyncRetFunc1((TestClass *)local_1e8,&stack0xfffffffffffffdf8);
  TestClass::SyncRetFunc2((TestClass *)local_1e8,&stack0xfffffffffffffdf8,ccg1.mCount);
  TestClass::SyncRetFunc3
            ((TestClass *)local_1e8,&stack0xfffffffffffffdf8,ccg1.mCount,(uint16_t *)&uStack_20e);
  TestClass::SyncRetFunc4
            ((TestClass *)local_1e8,&stack0xfffffffffffffdf8,ccg1.mCount,(uint16_t *)&uStack_20e,
             (CopyCounterGuy *)((long)&p5 + 4));
  TestClass::SyncRetFunc5
            ((TestClass *)local_22c,(uint64_t *)local_1e8,(uint32_t)&stack0xfffffffffffffdf8,
             (uint16_t *)(ulong)(uint)ccg1.mCount,(CopyCounterGuy *)&uStack_20e,
             (uint8_t *)((long)&p5 + 4));
  TestClass::CopyCounterGuy::operator=(&local_1ec,(CopyCounterGuy *)local_22c);
  TestClass::SyncRetFunc6
            ((TestClass *)local_1e8,&stack0xfffffffffffffdf8,ccg1.mCount,(uint16_t *)&uStack_20e,
             (CopyCounterGuy *)((long)&p5 + 4),(uint8_t *)((long)&p5 + 3),(int64_t *)&p9);
  TestClass::SyncRetFunc7
            ((TestClass *)local_1e8,&stack0xfffffffffffffdf8,ccg1.mCount,(uint16_t *)&uStack_20e,
             (CopyCounterGuy *)((long)&p5 + 4),(uint8_t *)((long)&p5 + 3),(int64_t *)&p9,&local_224)
  ;
  TestClass::SyncRetFunc8
            ((TestClass *)local_1e8,&stack0xfffffffffffffdf8,ccg1.mCount,(uint16_t *)&uStack_20e,
             (CopyCounterGuy *)((long)&p5 + 4),(uint8_t *)((long)&p5 + 3),(int64_t *)&p9,&local_224,
             &local_226);
  TestClass::SyncRetFunc9
            ((TestClass *)local_1e8,&stack0xfffffffffffffdf8,ccg1.mCount,(uint16_t *)&uStack_20e,
             (CopyCounterGuy *)((long)&p5 + 4),(uint8_t *)((long)&p5 + 3),(int64_t *)&p9,&local_224,
             &local_226,&local_227);
  TestClass::SyncRetFunc10
            ((TestClass *)local_1e8,&stack0xfffffffffffffdf8,ccg1.mCount,(uint16_t *)&uStack_20e,
             (CopyCounterGuy *)((long)&p5 + 4),(uint8_t *)((long)&p5 + 3),(int64_t *)&p9,&local_224,
             &local_226,&local_227,&local_228);
  TestClass::~TestClass((TestClass *)local_1e8);
  return;
}

Assistant:

void runSyncRetTests()
{
	TestClass app;
	
	TestClass::CopyCounterGuy returnCCG;
	
	uint64_t p1 = 1024;
	uint32_t p2 = 512;
	uint16_t p3 = 256;
	TestClass::CopyCounterGuy ccg1;
	uint8_t p4 = 16;
	int64_t p5 = -1024;
	int32_t p6 = -512;
	int16_t p7 = -256;
	int8_t p8 = -16;
	bool p9 = true;
	
	app.SyncRetFunc0();
	app.SyncRetFunc1(p1);
	app.SyncRetFunc2(p1, p2);
	app.SyncRetFunc3(p1, p2, p3);
	app.SyncRetFunc4(p1, p2, p3, ccg1);
	returnCCG = app.SyncRetFunc5(p1, p2, p3, ccg1, p4);
	LOG_INFO("Total copies after SyncRetFunc5(%d)", returnCCG.getCount());
	app.SyncRetFunc6(p1, p2, p3, ccg1, p4, p5);
	app.SyncRetFunc7(p1, p2, p3, ccg1, p4, p5, p6);
	app.SyncRetFunc8(p1, p2, p3, ccg1, p4, p5, p6, p7);
	app.SyncRetFunc9(p1, p2, p3, ccg1, p4, p5, p6, p7, p8);
	app.SyncRetFunc10(p1, p2, p3, ccg1, p4, p5, p6, p7, p8, p9);
	
	LOG_INFO("SyncRet tests complete!");
}